

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.h
# Opt level: O0

void __thiscall cmLoadCommandCommand::~cmLoadCommandCommand(cmLoadCommandCommand *this)

{
  cmLoadCommandCommand *this_local;
  
  ~cmLoadCommandCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmLoadCommandCommand; }